

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjLoader.cpp
# Opt level: O3

void __thiscall ObjLoader::loadBinaryFile(ObjLoader *this,string *filename)

{
  vec3 *pvVar1;
  float32 *pfVar2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar3;
  pointer pSVar4;
  void *pvVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  uint64_t uVar9;
  uchar *puVar10;
  mapped_type *pmVar11;
  IBO *ibo;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *v_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  pointer pSVar12;
  bool bVar13;
  vector<char,_std::allocator<char>_> v;
  string magic;
  int32 value;
  ifstream file;
  char magicBuffer [255];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c0;
  ObjLoader *local_3a0;
  size_type local_398;
  allocator_type local_389;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_388;
  int local_368;
  undefined4 uStack_364;
  long local_358;
  int local_34c;
  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Image<unsigned_char>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Image<unsigned_char>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *local_348;
  istream local_340 [520];
  long local_138;
  long local_130;
  char local_128;
  
  local_3a0 = this;
  std::ifstream::ifstream(local_340,(filename->_M_dataplus)._M_p,_S_in);
  memset(&local_138,0,0xff);
  std::istream::read((char *)local_340,(long)&local_138);
  if ((local_128 != '\0' || local_138 != 0x5f52455454494c47) || local_130 != 0xa4a424f5f4e4942) {
    __assert_fail("!strcmp(magicBuffer, GLITTER_BINFILE_MAGIC) && \"ObjLoader::loadBinaryFile(): Wrong file magic number\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/DrLSimon[P]glitter/src/ObjLoader.cpp"
                  ,0x110,"void ObjLoader::loadBinaryFile(const std::string &)");
  }
  local_388._M_dataplus._M_p = (pointer)&local_388.field_2;
  local_388._M_string_length = 0;
  local_388.field_2._M_local_buf[0] = '\0';
  uVar9 = readStringLength(local_340);
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)&local_3c0,uVar9,(allocator_type *)&local_368);
  std::istream::read((char *)local_340,(long)local_3c0._M_dataplus._M_p);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&local_388,0,local_388._M_string_length,local_3c0._M_dataplus._M_p,uVar9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c0._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete(local_3c0._M_dataplus._M_p,
                    CONCAT71(local_3c0.field_2._M_allocated_capacity._1_7_,
                             local_3c0.field_2._M_local_buf[0]) - (long)local_3c0._M_dataplus._M_p);
  }
  iVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_388,"[VertexPositions]");
  if (iVar8 != 0) {
    __assert_fail("(magic == \"[VertexPositions]\") && \"ObjLoader::loadBinaryFile(): Tag not found\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/DrLSimon[P]glitter/src/ObjLoader.cpp"
                  ,0x115,"void ObjLoader::loadBinaryFile(const std::string &)");
  }
  read<glm::vec<3,float,(glm::qualifier)0>>(&local_3a0->m_vertexPositions,local_340);
  uVar9 = readStringLength(local_340);
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)&local_3c0,uVar9,(allocator_type *)&local_368);
  std::istream::read((char *)local_340,(long)local_3c0._M_dataplus._M_p);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&local_388,0,local_388._M_string_length,local_3c0._M_dataplus._M_p,uVar9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c0._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete(local_3c0._M_dataplus._M_p,
                    CONCAT71(local_3c0.field_2._M_allocated_capacity._1_7_,
                             local_3c0.field_2._M_local_buf[0]) - (long)local_3c0._M_dataplus._M_p);
  }
  iVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_388,"[VertexColors]");
  if (iVar8 != 0) {
    __assert_fail("(magic == \"[VertexColors]\") && \"ObjLoader::loadBinaryFile(): Tag not found\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/DrLSimon[P]glitter/src/ObjLoader.cpp"
                  ,0x119,"void ObjLoader::loadBinaryFile(const std::string &)");
  }
  read<glm::vec<4,float,(glm::qualifier)0>>(&local_3a0->m_vertexColors,local_340);
  uVar9 = readStringLength(local_340);
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)&local_3c0,uVar9,(allocator_type *)&local_368);
  std::istream::read((char *)local_340,(long)local_3c0._M_dataplus._M_p);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&local_388,0,local_388._M_string_length,local_3c0._M_dataplus._M_p,uVar9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c0._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete(local_3c0._M_dataplus._M_p,
                    CONCAT71(local_3c0.field_2._M_allocated_capacity._1_7_,
                             local_3c0.field_2._M_local_buf[0]) - (long)local_3c0._M_dataplus._M_p);
  }
  iVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_388,"[VertexUVs]");
  if (iVar8 != 0) {
    __assert_fail("(magic == \"[VertexUVs]\") && \"ObjLoader::loadBinaryFile(): Tag not found\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/DrLSimon[P]glitter/src/ObjLoader.cpp"
                  ,0x11d,"void ObjLoader::loadBinaryFile(const std::string &)");
  }
  read<glm::vec<2,float,(glm::qualifier)0>>(&local_3a0->m_vertexUVs,local_340);
  uVar9 = readStringLength(local_340);
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)&local_3c0,uVar9,(allocator_type *)&local_368);
  std::istream::read((char *)local_340,(long)local_3c0._M_dataplus._M_p);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&local_388,0,local_388._M_string_length,local_3c0._M_dataplus._M_p,uVar9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c0._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete(local_3c0._M_dataplus._M_p,
                    CONCAT71(local_3c0.field_2._M_allocated_capacity._1_7_,
                             local_3c0.field_2._M_local_buf[0]) - (long)local_3c0._M_dataplus._M_p);
  }
  iVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_388,"[VertexNormals]");
  if (iVar8 != 0) {
    __assert_fail("(magic == \"[VertexNormals]\") && \"ObjLoader::loadBinaryFile(): Tag not found\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/DrLSimon[P]glitter/src/ObjLoader.cpp"
                  ,0x121,"void ObjLoader::loadBinaryFile(const std::string &)");
  }
  read<glm::vec<3,float,(glm::qualifier)0>>(&local_3a0->m_vertexNormals,local_340);
  uVar9 = readStringLength(local_340);
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)&local_3c0,uVar9,(allocator_type *)&local_368);
  std::istream::read((char *)local_340,(long)local_3c0._M_dataplus._M_p);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&local_388,0,local_388._M_string_length,local_3c0._M_dataplus._M_p,uVar9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c0._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete(local_3c0._M_dataplus._M_p,
                    CONCAT71(local_3c0.field_2._M_allocated_capacity._1_7_,
                             local_3c0.field_2._M_local_buf[0]) - (long)local_3c0._M_dataplus._M_p);
  }
  iVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_388,"[VertexTangents]");
  if (iVar8 != 0) {
    __assert_fail("(magic == \"[VertexTangents]\") && \"ObjLoader::loadBinaryFile(): Tag not found\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/DrLSimon[P]glitter/src/ObjLoader.cpp"
                  ,0x125,"void ObjLoader::loadBinaryFile(const std::string &)");
  }
  read<glm::vec<3,float,(glm::qualifier)0>>(&local_3a0->m_vertexTangents,local_340);
  uVar9 = readStringLength(local_340);
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)&local_3c0,uVar9,(allocator_type *)&local_368);
  std::istream::read((char *)local_340,(long)local_3c0._M_dataplus._M_p);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&local_388,0,local_388._M_string_length,local_3c0._M_dataplus._M_p,uVar9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c0._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete(local_3c0._M_dataplus._M_p,
                    CONCAT71(local_3c0.field_2._M_allocated_capacity._1_7_,
                             local_3c0.field_2._M_local_buf[0]) - (long)local_3c0._M_dataplus._M_p);
  }
  iVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_388,"[IBOS]");
  if (iVar8 != 0) {
    __assert_fail("(magic == \"[IBOS]\") && \"ObjLoader::loadBinaryFile(): Tag not found\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/DrLSimon[P]glitter/src/ObjLoader.cpp"
                  ,0x129,"void ObjLoader::loadBinaryFile(const std::string &)");
  }
  std::istream::read((char *)local_340,(long)&local_398);
  swapEndianness(&local_398);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::resize(&local_3a0->m_ibos,local_398);
  v_00 = (local_3a0->m_ibos).
         super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
  pvVar3 = (local_3a0->m_ibos).
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (v_00 != pvVar3) {
    do {
      read<unsigned_int>(v_00,local_340);
      v_00 = v_00 + 1;
    } while (v_00 != pvVar3);
  }
  uVar9 = readStringLength(local_340);
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)&local_3c0,uVar9,(allocator_type *)&local_368);
  std::istream::read((char *)local_340,(long)local_3c0._M_dataplus._M_p);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&local_388,0,local_388._M_string_length,local_3c0._M_dataplus._M_p,uVar9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c0._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete(local_3c0._M_dataplus._M_p,
                    CONCAT71(local_3c0.field_2._M_allocated_capacity._1_7_,
                             local_3c0.field_2._M_local_buf[0]) - (long)local_3c0._M_dataplus._M_p);
  }
  iVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_388,"[NamedTextureImages]");
  if (iVar8 == 0) {
    std::istream::read((char *)local_340,(long)&local_398);
    swapEndianness(&local_398);
    bVar13 = local_398 != 0;
    local_398 = local_398 - 1;
    if (bVar13) {
      local_348 = (_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Image<unsigned_char>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Image<unsigned_char>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   *)&local_3a0->m_images;
      do {
        uVar9 = readStringLength(local_340);
        std::vector<char,_std::allocator<char>_>::vector
                  ((vector<char,_std::allocator<char>_> *)&local_3c0,uVar9,
                   (allocator_type *)&local_368);
        std::istream::read((char *)local_340,(long)local_3c0._M_dataplus._M_p);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
                  (&local_388,0,local_388._M_string_length,local_3c0._M_dataplus._M_p,uVar9);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3c0._M_dataplus._M_p !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          operator_delete(local_3c0._M_dataplus._M_p,
                          CONCAT71(local_3c0.field_2._M_allocated_capacity._1_7_,
                                   local_3c0.field_2._M_local_buf[0]) -
                          (long)local_3c0._M_dataplus._M_p);
        }
        iVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                compare(&local_388,"_Image_");
        if (iVar8 != 0) {
          __assert_fail("(magic == \"_Image_\") && \"ObjLoader::loadBinaryFile(): Tag not found\"",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/DrLSimon[P]glitter/src/ObjLoader.cpp"
                        ,0x138,"void ObjLoader::loadBinaryFile(const std::string &)");
        }
        local_3c0._M_string_length = 0;
        local_3c0.field_2._M_local_buf[0] = '\0';
        local_3c0._M_dataplus._M_p = (pointer)&local_3c0.field_2;
        uVar9 = readStringLength(local_340);
        std::vector<char,_std::allocator<char>_>::vector
                  ((vector<char,_std::allocator<char>_> *)&local_368,uVar9,&local_389);
        std::istream::read((char *)local_340,CONCAT44(uStack_364,local_368));
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
                  (&local_3c0,0,local_3c0._M_string_length,(char *)CONCAT44(uStack_364,local_368),
                   uVar9);
        pvVar5 = (void *)CONCAT44(uStack_364,local_368);
        if (pvVar5 != (void *)0x0) {
          operator_delete(pvVar5,local_358 - (long)pvVar5);
        }
        std::istream::read((char *)local_340,(long)&local_368);
        swapEndianness((int32 *)&local_368);
        iVar8 = local_368;
        std::istream::read((char *)local_340,(long)&local_368);
        swapEndianness((int32 *)&local_368);
        local_34c = local_368;
        std::istream::read((char *)local_340,(long)&local_368);
        swapEndianness((int32 *)&local_368);
        iVar6 = local_368;
        std::istream::read((char *)local_340,(long)&local_368);
        swapEndianness((int32 *)&local_368);
        iVar7 = local_368;
        puVar10 = (uchar *)operator_new__((long)(iVar6 * local_368 * local_34c * iVar8));
        std::istream::read((char *)local_340,(long)puVar10);
        pmVar11 = std::__detail::
                  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Image<unsigned_char>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Image<unsigned_char>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[](local_348,&local_3c0);
        pmVar11->width = iVar8;
        pmVar11->height = local_34c;
        pmVar11->depth = iVar6;
        pmVar11->channels = iVar7;
        pmVar11->data = puVar10;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3c0._M_dataplus._M_p != &local_3c0.field_2) {
          operator_delete(local_3c0._M_dataplus._M_p,
                          CONCAT71(local_3c0.field_2._M_allocated_capacity._1_7_,
                                   local_3c0.field_2._M_local_buf[0]) + 1);
        }
        bVar13 = local_398 != 0;
        local_398 = local_398 - 1;
      } while (bVar13);
    }
    uVar9 = readStringLength(local_340);
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)&local_3c0,uVar9,(allocator_type *)&local_368)
    ;
    std::istream::read((char *)local_340,(long)local_3c0._M_dataplus._M_p);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
              (&local_388,0,local_388._M_string_length,local_3c0._M_dataplus._M_p,uVar9);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3c0._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete(local_3c0._M_dataplus._M_p,
                      CONCAT71(local_3c0.field_2._M_allocated_capacity._1_7_,
                               local_3c0.field_2._M_local_buf[0]) - (long)local_3c0._M_dataplus._M_p
                     );
    }
    iVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                      (&local_388,"[SimpleMaterials]");
    if (iVar8 == 0) {
      std::istream::read((char *)local_340,(long)&local_398);
      swapEndianness(&local_398);
      std::vector<SimpleMaterial,_std::allocator<SimpleMaterial>_>::resize
                (&local_3a0->m_materials,local_398);
      pSVar12 = (local_3a0->m_materials).
                super__Vector_base<SimpleMaterial,_std::allocator<SimpleMaterial>_>._M_impl.
                super__Vector_impl_data._M_start;
      pSVar4 = (local_3a0->m_materials).
               super__Vector_base<SimpleMaterial,_std::allocator<SimpleMaterial>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (pSVar12 != pSVar4) {
        this_00 = &pSVar12->diffuseTexName;
        do {
          uVar9 = readStringLength(local_340);
          std::vector<char,_std::allocator<char>_>::vector
                    ((vector<char,_std::allocator<char>_> *)&local_3c0,uVar9,
                     (allocator_type *)&local_368);
          std::istream::read((char *)local_340,(long)local_3c0._M_dataplus._M_p);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          _M_replace(&local_388,0,local_388._M_string_length,local_3c0._M_dataplus._M_p,uVar9);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3c0._M_dataplus._M_p !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            operator_delete(local_3c0._M_dataplus._M_p,
                            CONCAT71(local_3c0.field_2._M_allocated_capacity._1_7_,
                                     local_3c0.field_2._M_local_buf[0]) -
                            (long)local_3c0._M_dataplus._M_p);
          }
          iVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  compare(&local_388,"_Material_");
          if (iVar8 != 0) {
            __assert_fail("(magic == \"_Material_\") && \"ObjLoader::loadBinaryFile(): Tag not found\""
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/DrLSimon[P]glitter/src/ObjLoader.cpp"
                          ,0x152,"void ObjLoader::loadBinaryFile(const std::string &)");
          }
          uVar9 = readStringLength(local_340);
          std::vector<char,_std::allocator<char>_>::vector
                    ((vector<char,_std::allocator<char>_> *)&local_3c0,uVar9,
                     (allocator_type *)&local_368);
          std::istream::read((char *)local_340,(long)local_3c0._M_dataplus._M_p);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          _M_replace((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&this_00[-3].field_2 + 8),0,(size_type)this_00[-2]._M_dataplus._M_p,
                     local_3c0._M_dataplus._M_p,uVar9);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3c0._M_dataplus._M_p !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            operator_delete(local_3c0._M_dataplus._M_p,
                            CONCAT71(local_3c0.field_2._M_allocated_capacity._1_7_,
                                     local_3c0.field_2._M_local_buf[0]) -
                            (long)local_3c0._M_dataplus._M_p);
          }
          std::istream::read((char *)local_340,
                             (long)(&this_00[-2].field_2._M_allocated_capacity + 1));
          swapEndianness((vec3 *)(&this_00[-2].field_2._M_allocated_capacity + 1));
          pvVar1 = (vec3 *)((long)&this_00[-1]._M_dataplus._M_p + 4);
          std::istream::read((char *)local_340,(long)pvVar1);
          swapEndianness(pvVar1);
          std::istream::read((char *)local_340,(long)&this_00[-1].field_2);
          swapEndianness((vec3 *)&this_00[-1].field_2);
          pfVar2 = (float32 *)((long)&this_00[-1].field_2._M_allocated_capacity + 0xc);
          std::istream::read((char *)local_340,(long)pfVar2);
          swapEndianness(pfVar2);
          uVar9 = readStringLength(local_340);
          std::vector<char,_std::allocator<char>_>::vector
                    ((vector<char,_std::allocator<char>_> *)&local_3c0,uVar9,
                     (allocator_type *)&local_368);
          std::istream::read((char *)local_340,(long)local_3c0._M_dataplus._M_p);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          _M_replace(this_00,0,this_00->_M_string_length,local_3c0._M_dataplus._M_p,uVar9);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3c0._M_dataplus._M_p !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            operator_delete(local_3c0._M_dataplus._M_p,
                            CONCAT71(local_3c0.field_2._M_allocated_capacity._1_7_,
                                     local_3c0.field_2._M_local_buf[0]) -
                            (long)local_3c0._M_dataplus._M_p);
          }
          uVar9 = readStringLength(local_340);
          std::vector<char,_std::allocator<char>_>::vector
                    ((vector<char,_std::allocator<char>_> *)&local_3c0,uVar9,
                     (allocator_type *)&local_368);
          std::istream::read((char *)local_340,(long)local_3c0._M_dataplus._M_p);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          _M_replace(this_00 + 1,0,this_00[1]._M_string_length,local_3c0._M_dataplus._M_p,uVar9);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3c0._M_dataplus._M_p !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            operator_delete(local_3c0._M_dataplus._M_p,
                            CONCAT71(local_3c0.field_2._M_allocated_capacity._1_7_,
                                     local_3c0.field_2._M_local_buf[0]) -
                            (long)local_3c0._M_dataplus._M_p);
          }
          uVar9 = readStringLength(local_340);
          std::vector<char,_std::allocator<char>_>::vector
                    ((vector<char,_std::allocator<char>_> *)&local_3c0,uVar9,
                     (allocator_type *)&local_368);
          std::istream::read((char *)local_340,(long)local_3c0._M_dataplus._M_p);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          _M_replace(this_00 + 2,0,this_00[2]._M_string_length,local_3c0._M_dataplus._M_p,uVar9);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3c0._M_dataplus._M_p !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            operator_delete(local_3c0._M_dataplus._M_p,
                            CONCAT71(local_3c0.field_2._M_allocated_capacity._1_7_,
                                     local_3c0.field_2._M_local_buf[0]) -
                            (long)local_3c0._M_dataplus._M_p);
          }
          pSVar12 = (pointer)(this_00 + 3);
          this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    &this_00[5]._M_string_length;
        } while (pSVar12 != pSVar4);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_388._M_dataplus._M_p != &local_388.field_2) {
        operator_delete(local_388._M_dataplus._M_p,
                        CONCAT71(local_388.field_2._M_allocated_capacity._1_7_,
                                 local_388.field_2._M_local_buf[0]) + 1);
      }
      std::ifstream::~ifstream(local_340);
      return;
    }
    __assert_fail("(magic == \"[SimpleMaterials]\") && \"ObjLoader::loadBinaryFile(): Tag not found\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/DrLSimon[P]glitter/src/ObjLoader.cpp"
                  ,0x14c,"void ObjLoader::loadBinaryFile(const std::string &)");
  }
  __assert_fail("(magic == \"[NamedTextureImages]\") && \"ObjLoader::loadBinaryFile(): Tag not found\""
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/DrLSimon[P]glitter/src/ObjLoader.cpp"
                ,0x133,"void ObjLoader::loadBinaryFile(const std::string &)");
}

Assistant:

void ObjLoader::loadBinaryFile(const std::string & filename)
{
  std::ifstream file(filename.c_str());
  char magicBuffer[255];
  memset(magicBuffer, 0, 255);
  file.read(magicBuffer, strlen(GLITTER_BINFILE_MAGIC));
  assert(!strcmp(magicBuffer, GLITTER_BINFILE_MAGIC) && "ObjLoader::loadBinaryFile(): Wrong file magic number");

  std::string magic;

  read(magic, file);
  assert((magic == "[VertexPositions]") && "ObjLoader::loadBinaryFile(): Tag not found");
  read(m_vertexPositions, file);

  read(magic, file);
  assert((magic == "[VertexColors]") && "ObjLoader::loadBinaryFile(): Tag not found");
  read(m_vertexColors, file);

  read(magic, file);
  assert((magic == "[VertexUVs]") && "ObjLoader::loadBinaryFile(): Tag not found");
  read(m_vertexUVs, file);

  read(magic, file);
  assert((magic == "[VertexNormals]") && "ObjLoader::loadBinaryFile(): Tag not found");
  read(m_vertexNormals, file);

  read(magic, file);
  assert((magic == "[VertexTangents]") && "ObjLoader::loadBinaryFile(): Tag not found");
  read(m_vertexTangents, file);

  read(magic, file);
  assert((magic == "[IBOS]") && "ObjLoader::loadBinaryFile(): Tag not found");
  // IBOs
  std::uint64_t count;
  read(count, file);
  m_ibos.resize(count);
  for (IBO & ibo : m_ibos) {
    read(ibo, file);
  }

  read(magic, file);
  assert((magic == "[NamedTextureImages]") && "ObjLoader::loadBinaryFile(): Tag not found");
  // NamedTextureImages m_images;
  read(count, file);
  while (count--) {
    read(magic, file);
    assert((magic == "_Image_") && "ObjLoader::loadBinaryFile(): Tag not found");
    std::string name;
    read(name, file);
    Image<> image;
    glm::int32 value;
    read(value, file);
    image.width = value;
    read(value, file);
    image.height = value;
    read(value, file);
    image.depth = value;
    read(value, file);
    image.channels = value;
    size_t dataSize = image.width * image.height * image.depth * image.channels;
    image.data = new Image<>::value_type[dataSize];
    file.read(reinterpret_cast<char *>(image.data), dataSize * sizeof(Image<>::value_type));
    m_images.add(name, image);
  }

  read(magic, file);
  assert((magic == "[SimpleMaterials]") && "ObjLoader::loadBinaryFile(): Tag not found");
  // std::vector<SimpleMaterial> m_materials;
  read(count, file);
  m_materials.resize(count);
  for (SimpleMaterial & material : m_materials) {
    read(magic, file);
    assert((magic == "_Material_") && "ObjLoader::loadBinaryFile(): Tag not found");
    read(material.name, file);
    read(material.ambient, file);
    read(material.diffuse, file);
    read(material.specular, file);
    read(material.shininess, file);
    read(material.diffuseTexName, file);
    read(material.normalTexName, file);
    read(material.specularTexName, file);
  }
}